

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O0

int __thiscall sjtu::OrderManager::init(OrderManager *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar3;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  pair<std::pair<sjtu::orderType,_long>_*,_long> ret_1;
  pair<sjtu::orderType,_long> *tmp;
  pair<std::pair<sjtu::orderType,_long>_*,_long> ret;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_ffffffffffffff10;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  undefined8 local_90 [2];
  long local_80;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  OrderManager *local_8;
  undefined4 extraout_var_01;
  
  local_9 = (byte)ctx & 1;
  local_8 = this;
  if (((ulong)ctx & 1) == 0) {
    pFVar3 = (FileManager<std::pair<sjtu::orderType,_long>_> *)operator_new(0x228);
    local_45 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"OrderFile.dat",&local_31);
    uVar2 = (uint)((ulong)&local_31 >> 0x20);
    FileManager<std::pair<sjtu::orderType,_long>_>::FileManager
              ((FileManager<std::pair<sjtu::orderType,_long>_> *)in_stack_ffffffffffffff10,
               (string *)this,uVar2);
    local_45 = 0;
    this->OrderFile = pFVar3;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    pBVar4 = (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *)operator_new(0x18);
    local_6a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"PendingBpTree.dat",&local_69);
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::BplusTree(in_stack_ffffffffffffff10,(string *)this,uVar2);
    local_6a = 0;
    this->PendingBpTree = pBVar4;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (((this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).is_newfile &
        1U) == 0) {
      local_90[0] = 0;
      iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[2])(this->OrderFile,local_90);
      this->pending_id = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0xa0);
    }
    else {
      iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[1])();
      local_80 = CONCAT44(extraout_var,iVar1);
      *(undefined8 *)(local_80 + 0xb0) = extraout_RDX;
      *(undefined4 *)(local_80 + 0xa0) = 0;
      uVar2 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[3])(this->OrderFile,local_80 + 0xb0);
      this = (OrderManager *)(ulong)uVar2;
    }
    iVar1 = (int)this;
  }
  else {
    pFVar3 = this->OrderFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"OrderFile.dat",&local_b1);
    (**(pFVar3->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base)
              (pFVar3,local_b0,0x40,1);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    pBVar4 = this->PendingBpTree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"PendingBpTree.dat",&local_d9);
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::init(pBVar4,(EVP_PKEY_CTX *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
              _vptr_FileManager_Base[1])();
    lVar5 = CONCAT44(extraout_var_01,iVar1);
    *(undefined8 *)(lVar5 + 0xb0) = extraout_RDX_00;
    *(undefined4 *)(lVar5 + 0xa0) = 0;
    iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
              _vptr_FileManager_Base[3])(this->OrderFile,lVar5 + 0xb0);
  }
  return iVar1;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                OrderFile = new FileManager<std::pair<orderType, locType>>("OrderFile.dat" , OrderFile_cache_size);
                PendingBpTree = new BplusTree<std::pair<StringHasher::hashType, int>, locType>("PendingBpTree.dat" , PendingBpTree_cache_size);
                if (OrderFile->is_newfile) {
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
                } else {
                    auto tmp = OrderFile->read(0);
                    pending_id = tmp->first.num;
                }
            } else {
                OrderFile->init("OrderFile.dat", OrderFile_cache_size , true);
                PendingBpTree->init("PendingBpTree.dat", PendingBpTree_cache_size , true);
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
            }
        }